

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::getHandle(TestMoreStuffImpl *this,GetHandleContext context)

{
  _func_int **pp_Var1;
  CapTableBuilder *pCVar2;
  ClientHook *pCVar3;
  undefined8 *puVar4;
  long *in_RDX;
  Own<capnp::ClientHook,_std::nullptr_t> OVar5;
  PointerBuilder local_98;
  SegmentBuilder *local_78;
  Own<capnp::ClientHook,_std::nullptr_t> OStack_70;
  StructBuilder local_60;
  undefined1 local_38;
  
  local_38 = 0;
  (**(code **)(*in_RDX + 0x10))(&local_78);
  local_98.pointer = (WirePointer *)OStack_70.ptr;
  local_98.segment = local_78;
  local_98.capTable = (CapTableBuilder *)OStack_70.disposer;
  PointerBuilder::getStruct(&local_60,&local_98,(StructSize)0x10000,(word *)0x0);
  pp_Var1 = context.hook[2]._vptr_CallContextHook;
  puVar4 = (undefined8 *)operator_new(0x20);
  local_98.capTable = (CapTableBuilder *)(puVar4 + 2);
  puVar4[3] = 0;
  *puVar4 = 0x37aa58;
  puVar4[2] = 0x37aa88;
  puVar4[1] = pp_Var1;
  *(int *)pp_Var1 = *(int *)pp_Var1 + 1;
  local_98.segment = (SegmentBuilder *)&kj::_::HeapDisposer<capnp::_::HandleImpl>::instance;
  OVar5 = Capability::Client::makeLocalClient
                    ((Client *)&OStack_70,
                     (Own<capnp::Capability::Server,_std::nullptr_t> *)&local_98);
  pCVar2 = local_98.capTable;
  if (local_98.capTable != (CapTableBuilder *)0x0) {
    local_98.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_98.segment)->super_SegmentReader).arena)->_vptr_Arena)
              (local_98.segment,
               (pCVar2->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&(pCVar2->super_CapTableReader)._vptr_CapTableReader,OVar5.ptr);
  }
  local_78 = (SegmentBuilder *)&capnproto_test::capnp::test::TestHandle::Client::typeinfo;
  local_98.segment = local_60.segment;
  local_98.capTable = local_60.capTable;
  local_98.pointer = local_60.pointers;
  PointerBuilder::setCapability(&local_98,&OStack_70);
  pCVar3 = OStack_70.ptr;
  if (OStack_70.ptr != (ClientHook *)0x0) {
    OStack_70.ptr = (ClientHook *)0x0;
    (**((CapTableReader *)&(OStack_70.disposer)->_vptr_Disposer)->_vptr_CapTableReader)
              (OStack_70.disposer,
               (long)&((WireValue<uint32_t> *)&pCVar3->_vptr_ClientHook)->value +
               *(long *)(*(long *)&pCVar3->_vptr_ClientHook + -0x10));
  }
  kj::_::readyNow();
  *(SegmentBuilder **)&this->super_Server = local_60.segment;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::getHandle(GetHandleContext context) {
  context.getResults().setHandle(kj::heap<HandleImpl>(handleCount));
  return kj::READY_NOW;
}